

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O0

string * __thiscall MultiAgentDecisionProcess::SoftPrint_abi_cxx11_(MultiAgentDecisionProcess *this)

{
  ostream *poVar1;
  void *this_00;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  NamedDescribedEntity *in_stack_fffffffffffffda8;
  string local_1e8 [32];
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"Problem:");
  NamedDescribedEntity::GetName_abi_cxx11_(in_stack_fffffffffffffda8);
  poVar1 = std::operator<<(poVar1,local_1c8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1c8);
  poVar1 = std::operator<<(local_188,"descr.:");
  NamedDescribedEntity::GetDescription_abi_cxx11_(in_stack_fffffffffffffda8);
  poVar1 = std::operator<<(poVar1,local_1e8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1e8);
  poVar1 = std::operator<<(local_188,"nrAgents=");
  this_00 = (void *)std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0x50));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_188,"problem file=");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0x88));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_188,"unixName=");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0xa8));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string MultiAgentDecisionProcess::SoftPrint() const
{
    stringstream ss;
    ss << "Problem:"<< _m_name.GetName()<< endl;
    ss << "descr.:"<< _m_name.GetDescription() << endl;
    ss << "nrAgents=" << _m_nrAgents << endl;
    ss << "problem file=" << _m_problemFile << endl;
    ss << "unixName=" << _m_unixName << endl;
    return(ss.str());
}